

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

bool __thiscall HighFreqDataType::operator==(HighFreqDataType *this,HighFreqDataType *obj)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  sVar1 = (this->name)._M_string_length;
  if (sVar1 == (obj->name)._M_string_length) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((this->name)._M_dataplus._M_p,(obj->name)._M_dataplus._M_p,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  sVar1 = (this->origin)._M_string_length;
  if (sVar1 == (obj->origin)._M_string_length) {
    if (sVar1 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp((this->origin)._M_dataplus._M_p,(obj->origin)._M_dataplus._M_p,sVar1);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  sVar1 = (this->sockAddr)._M_string_length;
  if (sVar1 == (obj->sockAddr)._M_string_length) {
    if (sVar1 != 0) {
      iVar2 = bcmp((this->sockAddr)._M_dataplus._M_p,(obj->sockAddr)._M_dataplus._M_p,sVar1);
      bVar4 = (bool)(iVar2 == 0 & bVar4);
    }
  }
  else {
    bVar4 = false;
  }
  return (bool)(bVar4 & bVar3 & this->byteSize == obj->byteSize);
}

Assistant:

bool HighFreqDataType::operator ==(const HighFreqDataType &obj) {
    bool retval = true;
    if (name != obj.name)
        retval = false;
    if (origin != obj.origin)
        retval = false;
    if (sockAddr != obj.sockAddr)
        retval = false;
    if (byteSize != obj.byteSize)
        retval = false;

    return(retval);
}